

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O3

void equal_to_suite::run(void)

{
  compare_null_with_null();
  compare_null_with_boolean();
  compare_null_with_integer();
  compare_null_with_real();
  compare_null_with_string();
  compare_null_with_wstring();
  compare_null_with_u16string();
  compare_null_with_u32string();
  compare_boolean_with_null();
  compare_boolean_with_boolean();
  compare_boolean_with_integer();
  compare_boolean_with_real();
  compare_boolean_with_string();
  compare_boolean_with_wstring();
  compare_boolean_with_u16string();
  compare_boolean_with_u32string();
  return;
}

Assistant:

void run()
{
    // FIXME: More
    compare_null_with_null();
    compare_null_with_boolean();
    compare_null_with_integer();
    compare_null_with_real();
    compare_null_with_string();
    compare_null_with_wstring();
    compare_null_with_u16string();
    compare_null_with_u32string();

    compare_boolean_with_null();
    compare_boolean_with_boolean();
    compare_boolean_with_integer();
    compare_boolean_with_real();
    compare_boolean_with_string();
    compare_boolean_with_wstring();
    compare_boolean_with_u16string();
    compare_boolean_with_u32string();
}